

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall
fasttext::Model::predict
          (Model *this,vector<int,_std::allocator<int>_> *input,int32_t k,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden,Vector *output)

{
  _Iter_comp_iter<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)> __cmp;
  _Iter_comp_iter<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)> local_38;
  
  if (0 < k) {
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::reserve
              (heap,(ulong)(k + 1));
    computeHidden(this,input,hidden);
    if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->loss
        == hs) {
      dfs(this,k,this->osz_ * 2 + -2,0.0,heap,hidden);
    }
    else {
      findKBest(this,k,heap,hidden,output);
    }
    local_38._M_comp = comparePairs;
    std::
    __sort_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>>
              ((heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start,
               (heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish,&local_38);
    return;
  }
  __assert_fail("k > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/model.cc"
                ,0x7b,
                "void fasttext::Model::predict(const std::vector<int32_t> &, int32_t, std::vector<std::pair<real, int32_t>> &, Vector &, Vector &) const"
               );
}

Assistant:

void Model::predict(const std::vector<int32_t>& input, int32_t k,
                    std::vector<std::pair<real, int32_t>>& heap,
                    Vector& hidden, Vector& output) const {
  assert(k > 0);
  heap.reserve(k + 1);
  computeHidden(input, hidden);
  if (args_->loss == loss_name::hs) {
    dfs(k, 2 * osz_ - 2, 0.0, heap, hidden);
  } else {
    findKBest(k, heap, hidden, output);
  }
  std::sort_heap(heap.begin(), heap.end(), comparePairs);
}